

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void sum_update(mtree_writer *mtree,void *buff,size_t n)

{
  size_t local_30;
  size_t nn;
  uchar *p;
  size_t n_local;
  void *buff_local;
  mtree_writer *mtree_local;
  
  local_30 = n;
  nn = (size_t)buff;
  if ((mtree->compute_sum & 1U) != 0) {
    while (local_30 != 0) {
      mtree->crc = mtree->crc << 8 ^ crctab[mtree->crc >> 0x18 ^ (uint)*(byte *)nn];
      nn = nn + 1;
      local_30 = local_30 - 1;
    }
    mtree->crc_len = n + mtree->crc_len;
  }
  if ((mtree->compute_sum & 0x100U) != 0) {
    __archive_md5update(&mtree->md5ctx,buff,n);
  }
  if ((mtree->compute_sum & 0x2000U) != 0) {
    __archive_ripemd160update(&mtree->rmd160ctx,buff,n);
  }
  if ((mtree->compute_sum & 0x4000U) != 0) {
    __archive_sha1update(&mtree->sha1ctx,buff,n);
  }
  if ((mtree->compute_sum & 0x800000U) != 0) {
    __archive_sha256update(&mtree->sha256ctx,buff,n);
  }
  if ((mtree->compute_sum & 0x1000000U) != 0) {
    __archive_sha384update(&mtree->sha384ctx,buff,n);
  }
  if ((mtree->compute_sum & 0x2000000U) != 0) {
    __archive_sha512update(&mtree->sha512ctx,buff,n);
  }
  return;
}

Assistant:

static void
sum_update(struct mtree_writer *mtree, const void *buff, size_t n)
{
	if (mtree->compute_sum & F_CKSUM) {
		/*
		 * Compute a POSIX 1003.2 checksum
		 */
		const unsigned char *p;
		size_t nn;

		for (nn = n, p = buff; nn--; ++p)
			COMPUTE_CRC(mtree->crc, *p);
		mtree->crc_len += n;
	}
#ifdef ARCHIVE_HAS_MD5
	if (mtree->compute_sum & F_MD5)
		archive_md5_update(&mtree->md5ctx, buff, n);
#endif
#ifdef ARCHIVE_HAS_RMD160
	if (mtree->compute_sum & F_RMD160)
		archive_rmd160_update(&mtree->rmd160ctx, buff, n);
#endif
#ifdef ARCHIVE_HAS_SHA1
	if (mtree->compute_sum & F_SHA1)
		archive_sha1_update(&mtree->sha1ctx, buff, n);
#endif
#ifdef ARCHIVE_HAS_SHA256
	if (mtree->compute_sum & F_SHA256)
		archive_sha256_update(&mtree->sha256ctx, buff, n);
#endif
#ifdef ARCHIVE_HAS_SHA384
	if (mtree->compute_sum & F_SHA384)
		archive_sha384_update(&mtree->sha384ctx, buff, n);
#endif
#ifdef ARCHIVE_HAS_SHA512
	if (mtree->compute_sum & F_SHA512)
		archive_sha512_update(&mtree->sha512ctx, buff, n);
#endif
}